

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationData::getEquivalentScripts
          (CollationData *this,int32_t script,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int local_44;
  int local_40;
  int32_t i;
  int32_t length;
  int32_t index;
  UErrorCode *errorCode_local;
  int32_t capacity_local;
  int32_t *dest_local;
  int32_t script_local;
  CollationData *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    uVar2 = getScriptIndex(this,script);
    if (uVar2 == 0) {
      this_local._4_4_ = 0;
    }
    else if (script < 0x1000) {
      local_40 = 0;
      for (local_44 = 0; local_44 < this->numScripts; local_44 = local_44 + 1) {
        if (this->scriptsIndex[local_44] == uVar2) {
          if (local_40 < capacity) {
            dest[local_40] = local_44;
          }
          local_40 = local_40 + 1;
        }
      }
      if (capacity < local_40) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      this_local._4_4_ = local_40;
    }
    else {
      if (capacity < 1) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        *dest = script;
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationData::getEquivalentScripts(int32_t script,
                                    int32_t dest[], int32_t capacity,
                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    int32_t index = getScriptIndex(script);
    if(index == 0) { return 0; }
    if(script >= UCOL_REORDER_CODE_FIRST) {
        // Special groups have no aliases.
        if(capacity > 0) {
            dest[0] = script;
        } else {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }

    int32_t length = 0;
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            if(length < capacity) {
                dest[length] = i;
            }
            ++length;
        }
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}